

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)16>_> *
vkt::api::anon_unknown_1::PipelineLayout::create
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  ulong uVar1;
  VkPipelineLayoutCreateInfo pipelineLayoutInfo;
  VkPipelineLayoutCreateInfo local_38;
  
  local_38.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  local_38.pSetLayouts =
       (res->pSetLayouts).
       super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(res->pSetLayouts).
                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_38.pSetLayouts;
  if (uVar1 == 0) {
    local_38.pSetLayouts = (VkDescriptorSetLayout *)(pointer)0x0;
  }
  local_38.setLayoutCount = (deUint32)(uVar1 >> 3);
  local_38.pPushConstantRanges =
       (params->pushConstantRanges).
       super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl
       .super__Vector_impl_data._M_start;
  uVar1 = (long)(params->pushConstantRanges).
                super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_38.pPushConstantRanges;
  if (uVar1 == 0) {
    local_38.pPushConstantRanges = (pointer)0x0;
  }
  local_38.pushConstantRangeCount = (int)(uVar1 >> 2) * -0x55555555;
  ::vk::createPipelineLayout
            (__return_storage_ptr__,env->vkd,env->device,&local_38,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkPipelineLayout> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkPipelineLayoutCreateInfo	pipelineLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkPipelineLayoutCreateFlags)0,
			(deUint32)res.pSetLayouts.size(),
			(res.pSetLayouts.empty() ? DE_NULL : &res.pSetLayouts[0]),
			(deUint32)params.pushConstantRanges.size(),
			(params.pushConstantRanges.empty() ? DE_NULL : &params.pushConstantRanges[0]),
		};

		return createPipelineLayout(env.vkd, env.device, &pipelineLayoutInfo, env.allocationCallbacks);
	}